

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void prf_matrix_entry_f(prf_node_t *node,prf_state_t *state)

{
  ushort *in_RDI;
  matrix4x4_f32_t *in_stack_00000048;
  prf_state_t *in_stack_00000050;
  
  if (*in_RDI == prf_matrix_info.opcode) {
    prf_state_matrix_mult_right(in_stack_00000050,in_stack_00000048);
  }
  else {
    prf_error(9,"matrix entry state method on node of type %d.",(ulong)*in_RDI);
  }
  return;
}

Assistant:

static
void
prf_matrix_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( (node != NULL) && (state != NULL) );

    if ( node->opcode != prf_matrix_info.opcode ) {
        prf_error( 9, "matrix entry state method on node of type %d.",
            node->opcode );
        return;
    }

    prf_state_matrix_mult_right( state, (matrix4x4_f32_t *) node->data );
}